

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-diag.c
# Opt level: O1

void fy_diag_node_vreport(fy_diag *diag,fy_node *fyn,fy_error_type type,char *fmt,__va_list_tag *ap)

{
  byte bVar1;
  fy_diag_report_ctx drc;
  fy_diag_report_ctx local_58;
  
  if (diag != (fy_diag *)0x0 && fyn != (fy_node *)0x0) {
    bVar1 = diag->field_0x3c;
    diag->field_0x3c = bVar1 & 0xfe;
    local_58.fyt = (fy_token *)0x0;
    local_58.has_override = false;
    local_58._17_7_ = 0;
    local_58.override_file = (char *)0x0;
    local_58.override_line = 0;
    local_58.override_column = 0;
    local_58.module = FYEM_UNKNOWN;
    local_58.type = type;
    local_58.fyt = fy_node_token(fyn);
    fy_diag_vreport(diag,&local_58,fmt,ap);
    diag->field_0x3c = diag->field_0x3c & 0xfe | bVar1 & 1;
  }
  return;
}

Assistant:

void fy_diag_node_vreport(struct fy_diag *diag, struct fy_node *fyn,
                          enum fy_error_type type, const char *fmt, va_list ap) {
    struct fy_diag_report_ctx drc;
    bool save_on_error;

    if (!fyn || !diag)
        return;

    save_on_error = diag->on_error;
    diag->on_error = false;

    memset(&drc, 0, sizeof(drc));
    drc.type = type;
    drc.module = FYEM_UNKNOWN;
    drc.fyt = fy_node_token(fyn);
    fy_diag_vreport(diag, &drc, fmt, ap);

    diag->on_error = save_on_error;
}